

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O0

string * __thiscall
absl::flags_internal::AbslUnparseFlag_abi_cxx11_
          (string *__return_storage_ptr__,flags_internal *this,string_view v)

{
  allocator<char> local_21;
  undefined1 local_20 [8];
  string_view v_local;
  
  v_local._M_len = v._M_len;
  local_20 = (undefined1  [8])this;
  v_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_21);
  std::allocator<char>::~allocator(&local_21);
  return __return_storage_ptr__;
}

Assistant:

std::string AbslUnparseFlag(absl::string_view v) { return std::string(v); }